

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O0

Queue * lex_line(Source_File *src,Translation_Data *translation_data,char lex_defined_token)

{
  char cVar1;
  char cVar2;
  Queue *q;
  token *ptVar3;
  void *pvVar4;
  token *hold_closing_token;
  char just_in_case;
  Queue *tokens;
  token *hold_token;
  Source_File temp_src;
  char lex_defined_token_local;
  Translation_Data *translation_data_local;
  Source_File *src_local;
  
  temp_src._103_1_ = lex_defined_token;
  q = (Queue *)malloc(0x18);
  Queue_Init(q);
  memcpy(&hold_token,src,0x68);
  goto_new_line(src,translation_data);
  cVar1 = src->src[src->where_in_src];
  src->src[src->where_in_src] = '\0';
  translation_data->tokens = q;
  while (tokens = (Queue *)get_next_token((Source_File *)&hold_token,chonky,'\0'),
        ((token *)tokens)->type != KW_NOTYPE) {
    if ((((temp_src._103_1_ != '\0') && (((token *)tokens)->type == KW_ID)) &&
        (((token *)tokens)->data_size == 7)) &&
       (cVar2 = gstrn_cmp(((token *)tokens)->data,"defined",7), cVar2 != '\0')) {
      free(tokens);
      tokens = (Queue *)get_next_token((Source_File *)&hold_token,chonky,'\0');
      if (((token *)tokens)->type == KW_OPEN_NORMAL) {
        free(tokens);
        tokens = (Queue *)get_next_token((Source_File *)&hold_token,chonky,'\0');
        if (((token *)tokens)->type == KW_ID) {
          ptVar3 = get_next_token((Source_File *)&hold_token,chonky,'\0');
          if (ptVar3->type == KW_CLOSE_NORMAL) {
            pvVar4 = Map_Check(translation_data->macros,((token *)tokens)->data,
                               ((token *)tokens)->data_size);
            if (pvVar4 == (void *)0x0) {
              ((token *)tokens)->type = KW_DECIMAL_CONSTANT;
              ((token *)tokens)->data = "0";
              ((token *)tokens)->data_size = 1;
            }
            else {
              ((token *)tokens)->type = KW_DECIMAL_CONSTANT;
              ((token *)tokens)->data = "1";
              ((token *)tokens)->data_size = 1;
            }
          }
          else {
            push_lexing_error("expected an \')\' after id in define",src,translation_data);
          }
        }
        else {
          push_lexing_error("expected an id after \'(\' in defined",src,translation_data);
        }
      }
      else if (((token *)tokens)->type == KW_ID) {
        pvVar4 = Map_Check(translation_data->macros,((token *)tokens)->data,
                           ((token *)tokens)->data_size);
        if (pvVar4 == (void *)0x0) {
          ((token *)tokens)->type = KW_DECIMAL_CONSTANT;
          ((token *)tokens)->data = "0";
          ((token *)tokens)->data_size = 1;
        }
        else {
          ((token *)tokens)->type = KW_DECIMAL_CONSTANT;
          ((token *)tokens)->data = "1";
          ((token *)tokens)->data_size = 1;
        }
      }
      else {
        push_lexing_error("expected an id after define",src,translation_data);
      }
    }
    Queue_Push(q,tokens);
  }
  free(tokens);
  src->src[src->where_in_src] = cVar1;
  return q;
}

Assistant:

struct Queue* lex_line(struct Source_File *src,struct Translation_Data *translation_data,char lex_defined_token)
{

	struct Source_File temp_src;
	struct token *hold_token;
	struct Queue *tokens;
	char just_in_case;

	tokens=malloc(sizeof(struct Queue));
	Queue_Init(tokens);


	temp_src=*src;
	goto_new_line(src,translation_data);
	just_in_case=src->src[src->where_in_src];
	src->src[src->where_in_src]='\0';

	translation_data->tokens=tokens;
	
	while((hold_token=get_next_token(&temp_src,&chonky[0],0))->type!=KW_NOTYPE)
	{
		if(lex_defined_token && hold_token->type==KW_ID && hold_token->data_size==7 && gstrn_cmp(hold_token->data,"defined",7))
		{
			free(hold_token);
			hold_token=get_next_token(&temp_src,&chonky[0],0);
			if(hold_token->type==KW_OPEN_NORMAL)
			{
				free(hold_token);
				hold_token=get_next_token(&temp_src,&chonky[0],0);
				if(hold_token->type!=KW_ID)
				{
					push_lexing_error("expected an id after '(' in defined",src,translation_data);
				}else
				{
					struct token *hold_closing_token;
					hold_closing_token=get_next_token(&temp_src,&chonky[0],0);
					if(hold_closing_token->type!=KW_CLOSE_NORMAL)
					{
						push_lexing_error("expected an ')' after id in define",src,translation_data);
					}else
					{
						if(!Map_Check(translation_data->macros,hold_token->data,hold_token->data_size))
						{
							hold_token->type=KW_DECIMAL_CONSTANT;
							hold_token->data="0";
							hold_token->data_size=1;
						}else
						{
							hold_token->type=KW_DECIMAL_CONSTANT;
							hold_token->data="1";
							hold_token->data_size=1;
						}

					}
				}
			}else if(hold_token->type!=KW_ID)
			{
				push_lexing_error("expected an id after define",src,translation_data);
			}else
			{
				if(!Map_Check(translation_data->macros,hold_token->data,hold_token->data_size))
				{
					hold_token->type=KW_DECIMAL_CONSTANT;
					hold_token->data="0";
					hold_token->data_size=1;
				}else
				{
					hold_token->type=KW_DECIMAL_CONSTANT;
					hold_token->data="1";
					hold_token->data_size=1;
				}
			}
		}
		Queue_Push(tokens,hold_token);
	}

	free(hold_token);
	src->src[src->where_in_src]=just_in_case;

	return tokens;
}